

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall BarrierTest_CtorThrow_Test::TestBody(BarrierTest_CtorThrow_Test *this)

{
  char *message;
  bool bVar1;
  AssertHelper local_100;
  Message local_f8 [2];
  int *anon_var_0;
  type e;
  barrier<throwing_completion> local_b8;
  byte local_45;
  bool gtest_caught_expected;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  throwing_completion completion;
  BarrierTest_CtorThrow_Test *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    local_45 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::barrier<throwing_completion>::barrier(&local_b8,1,(long)&e + 7);
      yamc::barrier<throwing_completion>::~barrier(&local_b8);
    }
    if ((local_45 & 1) != 0) goto LAB_00168c99;
    std::__cxx11::string::operator=
              ((string *)auStack_38,
               "Expected: (yamc::barrier<throwing_completion>{1, completion}) throws an exception of type int.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_f8);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
             ,0x3e,message);
  testing::internal::AssertHelper::operator=(&local_100,local_f8);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::Message::~Message(local_f8);
LAB_00168c99:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  return;
}

Assistant:

TEST(BarrierTest, CtorThrow)
{
  struct throwing_completion {
    throwing_completion() = default;
    throwing_completion(const throwing_completion&) = default;
    throwing_completion(throwing_completion&&) {
      // move constructor throw exception
      throw 42;  // int
    }
    void operator()() {}
  } completion;
  EXPECT_THROW((yamc::barrier<throwing_completion>{1, completion}), int);
}